

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.cpp
# Opt level: O1

void duckdb_brotli::BrotliOptimizeHuffmanCountsForRle
               (size_t length,uint32_t *counts,uint8_t *good_for_rle)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  uint32_t uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  uint32_t *puVar13;
  ulong uVar14;
  size_t __n;
  uint32_t *puVar15;
  bool bVar16;
  int iVar18;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar22;
  
  if (length != 0) {
    sVar6 = 0;
    uVar8 = 0;
    do {
      uVar8 = (uVar8 + 1) - (ulong)(counts[sVar6] == 0);
      sVar6 = sVar6 + 1;
    } while (length != sVar6);
    if (0xf < uVar8) {
      puVar15 = counts + -1;
      do {
        if (puVar15[length] != 0) {
          uVar5 = 0x40000000;
          uVar10 = 0;
          uVar8 = 0;
          do {
            uVar14 = uVar8;
            uVar1 = counts[uVar10];
            uVar7 = uVar1;
            if (uVar5 < uVar1) {
              uVar7 = uVar5;
            }
            if (uVar1 == 0) {
              uVar7 = uVar5;
            }
            uVar5 = uVar7;
            uVar8 = (uVar1 != 0) + uVar14;
            uVar10 = uVar10 + 1;
          } while (uVar10 < length);
          if (uVar8 < 5) {
            return;
          }
          if (((uVar5 < 4) && (((length - 1) + (ulong)(uVar1 == 0)) - uVar14 < 6)) &&
             (1 < length - 1)) {
            uVar10 = 1;
            do {
              if (((counts[uVar10 - 1] != 0) && (counts[uVar10] == 0)) && (counts[uVar10 + 1] != 0))
              {
                counts[uVar10] = 1;
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 < length - 1);
          }
          if (uVar8 < 0x1c) {
            return;
          }
          uVar10 = 0;
          switchD_0130b471::default(good_for_rle,0,length);
          uVar9 = *counts;
          uVar8 = 0;
          do {
            if ((length == uVar8) || (counts[uVar8] != uVar9)) {
              if ((uVar9 == 0 && 4 < uVar10) || (6 < uVar10 && uVar9 != 0)) {
                __n = uVar10 + (uVar10 == 0);
                switchD_0130b471::default(good_for_rle + (uVar8 - __n),1,__n);
              }
              uVar10 = 1;
              if (length != uVar8) {
                uVar9 = counts[uVar8];
              }
            }
            else {
              uVar10 = uVar10 + 1;
            }
            auVar4 = _DAT_01ddfbb0;
            auVar3 = _DAT_01ddeb50;
            auVar2 = _DAT_01ddeb40;
            bVar16 = uVar8 < length;
            uVar8 = uVar8 + 1;
          } while (bVar16);
          uVar8 = (ulong)(((counts[1] + *counts + counts[2]) * 0x100) / 3 + 0x1a4);
          lVar11 = 0;
          uVar14 = 0;
          uVar10 = 0;
          do {
            if (((length == uVar10) || (good_for_rle[uVar10] != '\0')) ||
               (((uVar10 != 0 && (good_for_rle[uVar10 - 1] != '\0')) ||
                (((counts[uVar10] << 8) - uVar8) - 0x4d8 < 0xfffffffffffff650)))) {
              if ((3 < uVar14) || ((uVar14 == 3 && (lVar11 == 0)))) {
                uVar8 = (uVar14 >> 1) + lVar11;
                uVar9 = (uint32_t)(uVar8 / uVar14);
                if (uVar8 < uVar14) {
                  uVar9 = 1;
                }
                if (lVar11 == 0) {
                  uVar9 = 0;
                }
                lVar11 = uVar14 + (uVar14 == 0);
                lVar12 = lVar11 + -1;
                auVar17._8_4_ = (int)lVar12;
                auVar17._0_8_ = lVar12;
                auVar17._12_4_ = (int)((ulong)lVar12 >> 0x20);
                auVar17 = auVar17 ^ auVar3;
                uVar8 = 0;
                puVar13 = puVar15;
                auVar19 = auVar2;
                auVar20 = auVar4;
                do {
                  auVar21 = auVar19 ^ auVar3;
                  iVar18 = auVar17._4_4_;
                  if ((bool)(~(auVar21._4_4_ == iVar18 && auVar17._0_4_ < auVar21._0_4_ ||
                              iVar18 < auVar21._4_4_) & 1)) {
                    *puVar13 = uVar9;
                  }
                  if ((auVar21._12_4_ != auVar17._12_4_ || auVar21._8_4_ <= auVar17._8_4_) &&
                      auVar21._12_4_ <= auVar17._12_4_) {
                    counts[uVar10 + (uVar8 ^ 0x3ffffffffffffffe)] = uVar9;
                  }
                  iVar22 = SUB164(auVar20 ^ auVar3,4);
                  if (iVar22 <= iVar18 &&
                      (iVar22 != iVar18 || SUB164(auVar20 ^ auVar3,0) <= auVar17._0_4_)) {
                    counts[uVar10 + (uVar8 ^ 0x3ffffffffffffffd)] = uVar9;
                    counts[uVar10 + (uVar8 ^ 0x3ffffffffffffffc)] = uVar9;
                  }
                  uVar8 = uVar8 + 4;
                  lVar12 = auVar19._8_8_;
                  auVar19._0_8_ = auVar19._0_8_ + 4;
                  auVar19._8_8_ = lVar12 + 4;
                  lVar12 = auVar20._8_8_;
                  auVar20._0_8_ = auVar20._0_8_ + 4;
                  auVar20._8_8_ = lVar12 + 4;
                  puVar13 = puVar13 + -4;
                } while ((lVar11 + 3U & 0xfffffffffffffffc) != uVar8);
              }
              if (uVar10 < length - 2) {
                uVar5 = ((counts[uVar10 + 1] + counts[uVar10] + counts[uVar10 + 2]) * 0x100) / 3 +
                        0x1a4;
LAB_01d78ab7:
                uVar8 = (ulong)uVar5;
              }
              else {
                if (uVar10 < length) {
                  uVar5 = counts[uVar10] << 8;
                  goto LAB_01d78ab7;
                }
                uVar8 = 0;
              }
              uVar14 = 0;
              lVar11 = 0;
            }
            uVar14 = uVar14 + 1;
            if (length != uVar10) {
              lVar11 = lVar11 + (ulong)counts[uVar10];
              if (3 < uVar14) {
                uVar8 = ((uVar14 >> 1) + lVar11 * 0x100) / uVar14;
              }
              if (uVar14 == 4) {
                uVar8 = uVar8 + 0x78;
              }
            }
            puVar15 = puVar15 + 1;
            bVar16 = length <= uVar10;
            uVar10 = uVar10 + 1;
            if (bVar16) {
              return;
            }
          } while( true );
        }
        length = length - 1;
      } while (length != 0);
    }
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliOptimizeHuffmanCountsForRle(size_t length, uint32_t* counts,
                                       uint8_t* good_for_rle) {
  size_t nonzero_count = 0;
  size_t stride;
  size_t limit;
  size_t sum;
  const size_t streak_limit = 1240;
  /* Let's make the Huffman code more compatible with RLE encoding. */
  size_t i;
  for (i = 0; i < length; i++) {
    if (counts[i]) {
      ++nonzero_count;
    }
  }
  if (nonzero_count < 16) {
    return;
  }
  while (length != 0 && counts[length - 1] == 0) {
    --length;
  }
  if (length == 0) {
    return;  /* All zeros. */
  }
  /* Now counts[0..length - 1] does not have trailing zeros. */
  {
    size_t nonzeros = 0;
    uint32_t smallest_nonzero = 1 << 30;
    for (i = 0; i < length; ++i) {
      if (counts[i] != 0) {
        ++nonzeros;
        if (smallest_nonzero > counts[i]) {
          smallest_nonzero = counts[i];
        }
      }
    }
    if (nonzeros < 5) {
      /* Small histogram will model it well. */
      return;
    }
    if (smallest_nonzero < 4) {
      size_t zeros = length - nonzeros;
      if (zeros < 6) {
        for (i = 1; i < length - 1; ++i) {
          if (counts[i - 1] != 0 && counts[i] == 0 && counts[i + 1] != 0) {
            counts[i] = 1;
          }
        }
      }
    }
    if (nonzeros < 28) {
      return;
    }
  }
  /* 2) Let's mark all population counts that already can be encoded
     with an RLE code. */
  memset(good_for_rle, 0, length);
  {
    /* Let's not spoil any of the existing good RLE codes.
       Mark any seq of 0's that is longer as 5 as a good_for_rle.
       Mark any seq of non-0's that is longer as 7 as a good_for_rle. */
    uint32_t symbol = counts[0];
    size_t step = 0;
    for (i = 0; i <= length; ++i) {
      if (i == length || counts[i] != symbol) {
        if ((symbol == 0 && step >= 5) ||
            (symbol != 0 && step >= 7)) {
          size_t k;
          for (k = 0; k < step; ++k) {
            good_for_rle[i - k - 1] = 1;
          }
        }
        step = 1;
        if (i != length) {
          symbol = counts[i];
        }
      } else {
        ++step;
      }
    }
  }
  /* 3) Let's replace those population counts that lead to more RLE codes.
     Math here is in 24.8 fixed point representation. */
  stride = 0;
  limit = 256 * (counts[0] + counts[1] + counts[2]) / 3 + 420;
  sum = 0;
  for (i = 0; i <= length; ++i) {
    if (i == length || good_for_rle[i] ||
        (i != 0 && good_for_rle[i - 1]) ||
        (256 * counts[i] - limit + streak_limit) >= 2 * streak_limit) {
      if (stride >= 4 || (stride >= 3 && sum == 0)) {
        size_t k;
        /* The stride must end, collapse what we have, if we have enough (4). */
        size_t count = (sum + stride / 2) / stride;
        if (count == 0) {
          count = 1;
        }
        if (sum == 0) {
          /* Don't make an all zeros stride to be upgraded to ones. */
          count = 0;
        }
        for (k = 0; k < stride; ++k) {
          /* We don't want to change value at counts[i],
             that is already belonging to the next stride. Thus - 1. */
          counts[i - k - 1] = (uint32_t)count;
        }
      }
      stride = 0;
      sum = 0;
      if (i < length - 2) {
        /* All interesting strides have a count of at least 4, */
        /* at least when non-zeros. */
        limit = 256 * (counts[i] + counts[i + 1] + counts[i + 2]) / 3 + 420;
      } else if (i < length) {
        limit = 256 * counts[i];
      } else {
        limit = 0;
      }
    }
    ++stride;
    if (i != length) {
      sum += counts[i];
      if (stride >= 4) {
        limit = (256 * sum + stride / 2) / stride;
      }
      if (stride == 4) {
        limit += 120;
      }
    }
  }
}